

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gme.cpp
# Opt level: O0

gme_type_t gme_identify_extension(char *extension_)

{
  int iVar1;
  char *pcVar2;
  char *in_RDI;
  gme_type_t *types;
  char extension [6];
  char *end;
  gme_type_t *local_28;
  char *in_stack_ffffffffffffffe0;
  
  pcVar2 = strrchr(in_RDI,0x2e);
  if (pcVar2 != (char *)0x0) {
    in_RDI = pcVar2 + 1;
  }
  to_uppercase(in_RDI,(int)((ulong)pcVar2 >> 0x20),in_stack_ffffffffffffffe0);
  local_28 = gme_type_list();
  while( true ) {
    if (*local_28 == (gme_type_t)0x0) {
      return (gme_type_t)0x0;
    }
    iVar1 = strcmp(&stack0xffffffffffffffe2,(*local_28)->extension_);
    if (iVar1 == 0) break;
    local_28 = local_28 + 1;
  }
  return *local_28;
}

Assistant:

BLARGG_EXPORT gme_type_t gme_identify_extension( const char* extension_ )
{
	char const* end = strrchr( extension_, '.' );
	if ( end )
		extension_ = end + 1;
	
	char extension [6];
	to_uppercase( extension_, sizeof extension, extension );
	
	for ( gme_type_t const* types = gme_type_list(); *types; types++ )
		if ( !strcmp( extension, (*types)->extension_ ) )
			return *types;
	return 0;
}